

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

void missmm(monst *magr,monst *mdef,attack *mattk)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char local_228 [8];
  char mdef_name [256];
  char buf [256];
  char *fmt;
  attack *mattk_local;
  monst *mdef_local;
  monst *magr_local;
  
  if (vis == '\0') {
    noises(magr,mattk);
    return;
  }
  if (magr->wormno == '\0') {
    if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((magr->data->mflags3 & 0x200) != 0 && ((viz_array[magr->my][magr->mx] & 1U) != 0))))))))
    goto LAB_00216620;
LAB_002166ad:
    if (((((magr->data->mflags1 & 0x10000) != 0) ||
         ((poVar4 = which_armor(magr,4), poVar4 != (obj *)0x0 &&
          (poVar4 = which_armor(magr,4), poVar4->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(magr), bVar1 == '\0')))) {
      map_invisible(magr->mx,magr->my);
    }
  }
  else {
    bVar1 = worm_known(level,magr);
    if (bVar1 == '\0') goto LAB_002166ad;
LAB_00216620:
    if (((((((*(uint *)&magr->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&magr->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&magr->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_002166ad;
  }
  if (mdef->wormno == '\0') {
    if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_002169e3;
    if ((((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        ((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
       ((mdef->data->mflags3 & 0x200) != 0)) {
      bVar2 = viz_array[mdef->my][mdef->mx] & 1;
      goto joined_r0x002169dd;
    }
  }
  else {
    bVar2 = worm_known(level,mdef);
joined_r0x002169dd:
    if (bVar2 != 0) {
LAB_002169e3:
      if (((((((*(uint *)&mdef->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          (((*(uint *)&mdef->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mdef->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0))
      goto LAB_00216c4a;
    }
  }
  if (((((mdef->data->mflags1 & 0x10000) != 0) ||
       ((poVar4 = which_armor(mdef,4), poVar4 != (obj *)0x0 &&
        (poVar4 = which_armor(mdef,4), poVar4->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
        (((((u.uprops[0x19].intrinsic == 0 &&
            ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
           (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
         (u.uprops[0x19].blocked != 0)))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar1 = match_warn_of_mon(mdef), bVar1 == '\0')))) {
    map_invisible(mdef->mx,mdef->my);
  }
LAB_00216c4a:
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar3 = could_seduce(magr,mdef,mattk);
  bVar7 = false;
  if (iVar3 != 0) {
    bVar7 = (*(uint *)&magr->field_0x60 >> 8 & 1) == 0;
  }
  pcVar5 = "%s misses";
  if (bVar7) {
    pcVar5 = "%s pretends to be friendly to";
  }
  pcVar6 = Monnam(magr);
  sprintf(mdef_name + 0xf8,pcVar5,pcVar6);
  pcVar5 = mon_nam_too(local_228,mdef,magr);
  pline("%s %s.",mdef_name + 0xf8,pcVar5);
  return;
}

Assistant:

static void missmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	const char *fmt;
	char buf[BUFSZ], mdef_name[BUFSZ];

	if (vis) {
		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		fmt = (could_seduce(magr,mdef,mattk) && !magr->mcan) ?
			"%s pretends to be friendly to" : "%s misses";
		sprintf(buf, fmt, Monnam(magr));
		pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
	} else  noises(magr, mattk);
}